

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall higan::TcpServer::OnNewConnection(TcpServer *this,int socket,InetAddress *address)

{
  size_type *psVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_type *psVar3;
  undefined8 this_00;
  LogLevel LVar4;
  undefined8 *puVar5;
  EventLoop *loop;
  TcpConnection *this_01;
  pointer pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_378 [256];
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_60 [8];
  string connection_name;
  TcpConnectionPtr connection_ptr;
  
  psVar3 = &__str._M_string_length;
  pcVar6 = (this->server_name_)._M_dataplus._M_p;
  local_278 = (undefined1  [8])psVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar6,pcVar6 + (this->server_name_)._M_string_length);
  std::__cxx11::string::append((char *)local_278);
  InetAddress::GetIpPort_abi_cxx11_((string *)local_378,address);
  pcVar6 = (pointer)0xf;
  if (local_278 != (undefined1  [8])psVar3) {
    pcVar6 = (pointer)__str._M_string_length;
  }
  if (pcVar6 < __str._M_dataplus._M_p + local_378._8_8_) {
    pcVar6 = (pointer)0xf;
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      pcVar6 = (pointer)local_378._16_8_;
    }
    if (__str._M_dataplus._M_p + local_378._8_8_ <= pcVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_378,0,(char *)0x0,(ulong)local_278);
      goto LAB_0011dc77;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_278,local_378._0_8_);
LAB_0011dc77:
  local_60 = (undefined1  [8])&connection_name._M_string_length;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    connection_name._M_string_length = *psVar1;
    connection_name.field_2._M_allocated_capacity = puVar5[3];
  }
  else {
    connection_name._M_string_length = *psVar1;
    local_60 = (undefined1  [8])*puVar5;
  }
  connection_name._M_dataplus._M_p = (pointer)puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
  }
  if (local_278 != (undefined1  [8])psVar3) {
    operator_delete((void *)local_278,__str._M_string_length + 1);
  }
  loop = EventLoopThreadPool::GetNextEventLoop(&this->thread_pool_);
  this_01 = (TcpConnection *)operator_new(0x210);
  TcpConnection::TcpConnection(this_01,loop,(string *)local_60,socket,address);
  std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<higan::TcpConnection,void>
            ((__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
             (connection_name.field_2._M_local_buf + 8),this_01);
  TcpConnection::SetMessageCallback
            ((TcpConnection *)connection_name.field_2._8_8_,&this->message_callback_);
  this_00 = connection_name.field_2._8_8_;
  __str._M_dataplus._M_p = (pointer)0x0;
  local_278 = (undefined1  [8])operator_new(0x18);
  *(code **)local_278 = OnConnectionError;
  *(undefined8 *)((long)local_278 + 8) = 0;
  *(TcpServer **)((long)local_278 + 0x10) = this;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&),_std::_Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>_>
       ::_M_invoke;
  __str._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&),_std::_Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<higan::TcpConnection>_&)>_>
       ::_M_manager;
  TcpConnection::SetErrorCallback((TcpConnection *)this_00,(TcpConnectionCallback *)local_278);
  if (__str._M_string_length != 0) {
    (*(code *)__str._M_string_length)(local_278,local_278,3);
  }
  TcpConnection::SetNewConnectionCallback
            ((TcpConnection *)connection_name.field_2._8_8_,&this->newconnection_callback_);
  LVar4 = Logger::GetLogLevel();
  if ((int)LVar4 < 2) {
    Logger::Logger((Logger *)local_278,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpServer.cpp"
                   ,0x30,"OnNewConnection");
    Fmt::Fmt((Fmt *)local_378,"a new connection: %s create",local_60);
    Logger::operator<<((Logger *)local_278,(Fmt *)local_378);
    Logger::~Logger((Logger *)local_278);
  }
  local_278._0_4_ = socket;
  __str._M_dataplus._M_p = (pointer)connection_name.field_2._8_8_;
  __str._M_string_length =
       (size_type)
       connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &((connection_ptr.
                  super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
                super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var2 = &((connection_ptr.
                  super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
                super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
    }
  }
  std::
  _Rb_tree<int,std::pair<int_const,std::shared_ptr<higan::TcpConnection>>,std::_Select1st<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>>
  ::_M_insert_unique<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>
            ((_Rb_tree<int,std::pair<int_const,std::shared_ptr<higan::TcpConnection>>,std::_Select1st<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<higan::TcpConnection>>>>
              *)&this->connection_map_,
             (pair<const_int,_std::shared_ptr<higan::TcpConnection>_> *)local_278);
  if (__str._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
  }
  if (connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &((connection_ptr.
                  super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
                super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var2 = &((connection_ptr.
                  super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
                super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
    }
  }
  __str._M_dataplus._M_p = (pointer)0x0;
  local_278 = (undefined1  [8])operator_new(0x20);
  *(code **)local_278 = TcpConnection::ConnectionEstablished;
  *(undefined8 *)((long)local_278 + 8) = 0;
  *(undefined8 *)((long)local_278 + 0x10) = connection_name.field_2._8_8_;
  *(element_type **)((long)local_278 + 0x18) =
       connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>_>
       ::_M_invoke;
  __str._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(),_std::_Bind<void_(higan::TcpConnection::*(std::shared_ptr<higan::TcpConnection>))()>_>
       ::_M_manager;
  EventLoop::RunInLoop(loop,(EventLoopFunc *)local_278);
  if (__str._M_string_length != 0) {
    (*(code *)__str._M_string_length)(local_278,local_278,3);
  }
  if (connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               connection_ptr.super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (local_60 != (undefined1  [8])&connection_name._M_string_length) {
    operator_delete((void *)local_60,connection_name._M_string_length + 1);
  }
  return;
}

Assistant:

void TcpServer::OnNewConnection(int socket, const InetAddress& address)
{
	std::string connection_name = server_name_ + "-" + address.GetIpPort();

	EventLoop* loop = thread_pool_.GetNextEventLoop();

	TcpConnectionPtr connection_ptr(
			new TcpConnection(loop, connection_name, socket, address));

	connection_ptr->SetMessageCallback(message_callback_);
	connection_ptr->SetErrorCallback(std::bind(&TcpServer::OnConnectionError, this, _1));
	connection_ptr->SetNewConnectionCallback(newconnection_callback_);

	LOG_INFO << higan::Fmt("a new connection: %s create", connection_name.c_str());
	connection_map_.insert({socket, connection_ptr});

	/**
	 * 在新连接所属的loop中执行
	 * 这里因为是主线程运行, 所以ConnectionEstablished会被放入从线程的队列中
	 * 等待从线程执行
	 */
	loop->RunInLoop(std::bind(&TcpConnection::ConnectionEstablished, connection_ptr));
}